

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::WaitRTL8211F_Idle(FpgaIO *this,char *callerName,uint chan,uint loop_cnt)

{
  BasePort *pBVar1;
  uint uVar2;
  ostream *poVar3;
  void *pvVar4;
  bool bVar5;
  uint local_34;
  uint i;
  bool isIdle;
  ulong uStack_28;
  quadlet_t read_data;
  nodeaddr_t address;
  uint loop_cnt_local;
  uint chan_local;
  char *callerName_local;
  FpgaIO *this_local;
  
  address._0_4_ = loop_cnt;
  address._4_4_ = chan;
  _loop_cnt_local = callerName;
  callerName_local = (char *)this;
  Amp1394_Sleep(0.001);
  uStack_28 = (ulong)(address._4_4_ << 8 | 0x40a0);
  bVar5 = false;
  local_34 = 0;
  while( true ) {
    uVar2 = local_34;
    if (bVar5 == false) {
      local_34 = local_34 + 1;
    }
    if (bVar5 != false || (uint)address <= uVar2) break;
    pBVar1 = (this->super_BoardIO).port;
    uVar2 = (*pBVar1->_vptr_BasePort[0x23])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,uStack_28,&i);
    if ((uVar2 & 1) != 0) {
      bVar5 = (i & 0x7000000) == 0;
    }
  }
  if (bVar5 == false) {
    poVar3 = std::operator<<((ostream *)&std::cout,_loop_cnt_local);
    poVar3 = std::operator<<(poVar3," timeout waiting for idle, cnt ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_34);
    poVar3 = std::operator<<(poVar3,", read ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,i);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  }
  return bVar5;
}

Assistant:

bool FpgaIO::WaitRTL8211F_Idle(const char *callerName, unsigned int chan, unsigned int loop_cnt)
{
    // Should have firmware/hardware checks
    // First, wait 1 millisecond
    Amp1394_Sleep(0.001);
    // Now, check up to loop_cnt iterations
    nodeaddr_t address = 0x40a0 | (chan << 8);
    quadlet_t read_data;
    bool isIdle = false;
    unsigned int i = 0;
    while (!isIdle && (i++ < loop_cnt)) {
        if (port->ReadQuadlet(BoardId, address, read_data))
            isIdle = ((read_data&0x07000000) == 0);
    }
    if (!isIdle) {
        std::cout << callerName << " timeout waiting for idle, cnt " << i << ", read " << std::hex
                  << read_data << std::dec << std::endl;
    }
    return isIdle;
}